

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

vec2 __thiscall CGameClient::GetCharPos(CGameClient *this,int ClientID,bool Predicted)

{
  long lVar1;
  IClient *pIVar2;
  byte in_DL;
  float in_ESI;
  CGameClient *in_RDI;
  long in_FS_OFFSET;
  vec2 local_30;
  vector2_base<float> local_28;
  vector2_base<float> in_stack_ffffffffffffffe0;
  vector2_base<float> in_stack_ffffffffffffffe8;
  vec2 a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_DL & 1) == 0) {
    vector2_base<float>::vector2_base
              ((vector2_base<float> *)&stack0xffffffffffffffe0,
               (float)(in_RDI->m_Snap).m_aCharacters[(int)in_ESI].m_Prev.super_CNetObj_CharacterCore
                      .m_X,
               (float)(in_RDI->m_Snap).m_aCharacters[(int)in_ESI].m_Prev.super_CNetObj_CharacterCore
                      .m_Y);
    vector2_base<float>::vector2_base
              (&local_28,
               (float)(in_RDI->m_Snap).m_aCharacters[(int)in_ESI].m_Cur.super_CNetObj_CharacterCore.
                      m_X,
               (float)(in_RDI->m_Snap).m_aCharacters[(int)in_ESI].m_Cur.super_CNetObj_CharacterCore.
                      m_Y);
    pIVar2 = Client(in_RDI);
    IClient::IntraGameTick(pIVar2);
    local_30 = mix<vector2_base<float>,float>
                         (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_ESI);
  }
  else {
    a = in_RDI->m_aClients[(int)in_ESI].m_Predicted.m_Pos;
    pIVar2 = Client(in_RDI);
    IClient::PredIntraGameTick(pIVar2);
    local_30 = mix<vector2_base<float>,float>(a,in_stack_ffffffffffffffe0,in_ESI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

vec2 CGameClient::GetCharPos(int ClientID, bool Predicted) const
{
	if(Predicted)
	{
		return mix(
			m_aClients[ClientID].m_PrevPredicted.m_Pos,
			m_aClients[ClientID].m_Predicted.m_Pos,
			Client()->PredIntraGameTick()
		);
	}
	else
	{
		return mix(
			vec2(m_Snap.m_aCharacters[ClientID].m_Prev.m_X, m_Snap.m_aCharacters[ClientID].m_Prev.m_Y),
			vec2(m_Snap.m_aCharacters[ClientID].m_Cur.m_X, m_Snap.m_aCharacters[ClientID].m_Cur.m_Y),
			Client()->IntraGameTick()
		);
	}
}